

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O2

void __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>>
::
Initialize<absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,absl::lts_20250127::str_format_internal::FormatArgImpl_const*>>
          (Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>>
           *this,IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_const_absl::lts_20250127::str_format_internal::FormatArgImpl_*>
                 values,
          SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> new_size
          )

{
  undefined8 *puVar1;
  undefined8 uVar2;
  ulong uVar3;
  Pointer<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> pFVar4;
  long lVar5;
  SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> SVar6;
  bool bVar7;
  Allocation<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> AVar8;
  anon_class_1_0_00000001 local_1a;
  anon_class_1_0_00000001 local_19;
  
  uVar3 = *(ulong *)this;
  if ((uVar3 & 1) != 0) {
    Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
    ::
    Initialize<absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_const_absl::lts_20250127::str_format_internal::FormatArgImpl_*>_>
    ::anon_class_1_0_00000001::operator()(&local_19);
    uVar3 = *(ulong *)this;
  }
  if (1 < uVar3) {
    Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
    ::
    Initialize<absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_const_absl::lts_20250127::str_format_internal::FormatArgImpl_*>_>
    ::anon_class_1_0_00000001::operator()(&local_1a);
  }
  if (new_size < 5) {
    pFVar4 = (Pointer<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>)
             (this + 8);
  }
  else {
    SVar6 = 8;
    if (8 < new_size) {
      SVar6 = new_size;
    }
    AVar8 = MallocAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_false>
            ::Allocate((allocator<absl::lts_20250127::str_format_internal::FormatArgImpl> *)this,
                       SVar6);
    pFVar4 = AVar8.data;
    *(Allocation<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> *)
     (this + 8) = AVar8;
    *this = (Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>>
             )((byte)*this | 1);
  }
  lVar5 = 0;
  SVar6 = new_size;
  while (bVar7 = SVar6 != 0, SVar6 = SVar6 - 1, bVar7) {
    puVar1 = (undefined8 *)((long)&(values.it_)->data_ + lVar5);
    uVar2 = puVar1[1];
    *(undefined8 *)((pFVar4->data_).buf + lVar5) = *puVar1;
    *(undefined8 *)((pFVar4->data_).buf + lVar5 + 8) = uVar2;
    lVar5 = lVar5 + 0x10;
  }
  *(SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> *)this =
       *(long *)this + new_size * 2;
  return;
}

Assistant:

auto Storage<T, N, A>::Initialize(ValueAdapter values,
                                  SizeType<A> new_size) -> void {
  // Only callable from constructors!
  ABSL_HARDENING_ASSERT(!GetIsAllocated());
  ABSL_HARDENING_ASSERT(GetSize() == 0);

  Pointer<A> construct_data;
  if (new_size > GetInlinedCapacity()) {
    // Because this is only called from the `InlinedVector` constructors, it's
    // safe to take on the allocation with size `0`. If `ConstructElements(...)`
    // throws, deallocation will be automatically handled by `~Storage()`.
    SizeType<A> requested_capacity =
        ComputeCapacity(GetInlinedCapacity(), new_size);
    Allocation<A> allocation =
        MallocAdapter<A>::Allocate(GetAllocator(), requested_capacity);
    construct_data = allocation.data;
    SetAllocation(allocation);
    SetIsAllocated();
  } else {
    construct_data = GetInlinedData();
  }

  ConstructElements<A>(GetAllocator(), construct_data, values, new_size);

  // Since the initial size was guaranteed to be `0` and the allocated bit is
  // already correct for either case, *adding* `new_size` gives us the correct
  // result faster than setting it directly.
  AddSize(new_size);
}